

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_maybe.cpp
# Opt level: O1

void __thiscall Maybe_MoveAssign_Test::TestBody(Maybe_MoveAssign_Test *this)

{
  long *plVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> m3;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> m1;
  AssertHelper local_b0;
  AssertHelper local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  AssertHelper local_98;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined1 local_70 [8];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  type local_40;
  
  local_48[0] = (maybe<std::__cxx11::string,void>)0x0;
  plVar1 = (long *)(local_68 + 8);
  local_68._8_4_ = 0x74736574;
  local_68._0_8_ = (anon_struct_8_0_00000001_for___align)0x4;
  local_68._12_4_ = local_68._12_4_ & 0xffffff00;
  local_70 = (undefined1  [8])plVar1;
  pstore::maybe<std::__cxx11::string,void>::operator=
            ((maybe<std::__cxx11::string,void> *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  if (local_70 != (undefined1  [8])plVar1) {
    operator_delete((void *)local_70,CONCAT44(local_68._12_4_,local_68._8_4_) + 1);
  }
  local_90[0] = (internal)local_48[0];
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48[0] == (maybe<std::__cxx11::string,void>)0x0) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)local_90,(AssertionResult *)"m1.has_value ()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0xae,(char *)local_70);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_70 != (undefined1  [8])plVar1) {
      operator_delete((void *)local_70,CONCAT44(local_68._12_4_,local_68._8_4_) + 1);
    }
    if ((long *)CONCAT71(local_a8.data_._1_7_,local_a8.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_a8.data_._1_7_,local_a8.data_._0_1_) + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  pbVar2 = pstore::maybe<std::__cxx11::string,void>::
           value_impl<pstore::maybe<std::__cxx11::string,void>&,std::__cxx11::string>
                     ((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                       *)local_48);
  local_68._8_4_ = 0x74736574;
  local_68._0_8_ = (anon_struct_8_0_00000001_for___align)0x4;
  local_68._12_4_ = local_68._12_4_ & 0xffffff00;
  local_70 = (undefined1  [8])plVar1;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_90,"m1.value ()","\"test\"s",pbVar2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  if (local_70 != (undefined1  [8])plVar1) {
    operator_delete((void *)local_70,CONCAT44(local_68._12_4_,local_68._8_4_) + 1);
  }
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_70);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0xaf,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_70 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_70 + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  if (local_48[0] == (maybe<std::__cxx11::string,void>)0x1) {
    local_48[0] = (maybe<std::__cxx11::string,void>)0x0;
    if (local_40.__align != (anon_struct_8_0_00000001_for___align)((long)local_48 + 0x18)) {
      operator_delete((void *)local_40.__align,local_40._16_8_ + 1);
    }
  }
  local_48[0] = (maybe<std::__cxx11::string,void>)0x1;
  local_40.__align = (anon_struct_8_0_00000001_for___align)((long)local_48 + 0x18);
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_48 + 8),"before","");
  local_90[0] = (internal)local_48[0];
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48[0] == (maybe<std::__cxx11::string,void>)0x0) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)local_90,(AssertionResult *)0x1e6280,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0xb4,(char *)local_70);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_70 != (undefined1  [8])plVar1) {
      operator_delete((void *)local_70,CONCAT44(local_68._12_4_,local_68._8_4_) + 1);
    }
    if ((long *)CONCAT71(local_a8.data_._1_7_,local_a8.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_a8.data_._1_7_,local_a8.data_._0_1_) + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  local_70[0] = (internal)0x1;
  local_68._0_8_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"after","");
  local_a8.data_._0_1_ = (internal)local_48[0];
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48[0] == (maybe<std::__cxx11::string,void>)0x0) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_90,(internal *)&local_a8,(AssertionResult *)0x1e6280,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0xb6,(char *)local_90);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90 != (undefined1  [8])&local_80) {
      operator_delete((void *)local_90,
                      CONCAT26(local_80._M_allocated_capacity._6_2_,
                               CONCAT24(local_80._M_allocated_capacity._4_2_,
                                        local_80._M_allocated_capacity._0_4_)) + 1);
    }
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b0.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  pstore::
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator=((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             *)local_48,
            (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             *)local_70);
  local_a8.data_._0_1_ = (internal)local_48[0];
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48[0] == (maybe<std::__cxx11::string,void>)0x0) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_90,(internal *)&local_a8,(AssertionResult *)"m2.has_value ()","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0xb9,(char *)local_90);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90 != (undefined1  [8])&local_80) {
      operator_delete((void *)local_90,
                      CONCAT26(local_80._M_allocated_capacity._6_2_,
                               CONCAT24(local_80._M_allocated_capacity._4_2_,
                                        local_80._M_allocated_capacity._0_4_)) + 1);
    }
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b0.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_a8.data_._0_1_ = local_70[0];
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_90,(internal *)&local_a8,(AssertionResult *)"m3.has_value ()","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0xbd,(char *)local_90);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90 != (undefined1  [8])&local_80) {
      operator_delete((void *)local_90,
                      CONCAT26(local_80._M_allocated_capacity._6_2_,
                               CONCAT24(local_80._M_allocated_capacity._4_2_,
                                        local_80._M_allocated_capacity._0_4_)) + 1);
    }
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b0.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  pbVar2 = pstore::maybe<std::__cxx11::string,void>::
           value_impl<pstore::maybe<std::__cxx11::string,void>&,std::__cxx11::string>
                     ((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                       *)local_48);
  local_80._M_allocated_capacity._0_4_ = 0x65746661;
  local_80._M_allocated_capacity._4_2_ = 0x72;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5;
  local_90 = (undefined1  [8])&local_80;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_a8,"m2.value ()","\"after\"s",pbVar2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,
                    CONCAT26(local_80._M_allocated_capacity._6_2_,
                             CONCAT24(local_80._M_allocated_capacity._4_2_,
                                      local_80._M_allocated_capacity._0_4_)) + 1);
  }
  if (local_a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_90);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0xbf,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_90 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_90 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  if (local_70[0] == (internal)0x1) {
    local_70 = (undefined1  [8])((ulong)local_70 & 0xffffffffffffff00);
    if ((undefined1 *)local_68._0_8_ != local_58) {
      operator_delete((void *)local_68._0_8_,local_58._0_8_ + 1);
    }
  }
  if (local_48[0] == (maybe<std::__cxx11::string,void>)0x1) {
    local_48[0] = (maybe<std::__cxx11::string,void>)0x0;
    if (local_40.__align != (anon_struct_8_0_00000001_for___align)((long)local_48 + 0x18)) {
      operator_delete((void *)local_40.__align,local_40._16_8_ + 1);
    }
  }
  return;
}

Assistant:

TEST (Maybe, MoveAssign) {
    // No initial value
    {
        maybe<std::string> m1;
        EXPECT_FALSE (m1);
        m1 = "test"s;
        EXPECT_TRUE (m1.has_value ());
        EXPECT_EQ (m1.value (), "test"s);
    }
    // With an initial value
    {
        maybe<std::string> m2{"before"};
        EXPECT_TRUE (m2);
        maybe<std::string> m3{"after"};
        EXPECT_TRUE (m2);

        m2 = std::move (m3);
        EXPECT_TRUE (m2.has_value ());
        // Clang SA (correctly) warns that this is (strictly) undefined behavior. However, the
        // moved-from type is defined here and so is its behaviour that I would like to test.
#ifndef __clang_analyzer__
        EXPECT_TRUE (m3.has_value ()); // a moved-from maybe still contains a value.
#endif
        EXPECT_EQ (m2.value (), "after"s);
    }
}